

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Bug21371806(void)

{
  once_flag *this;
  bool bVar1;
  ostream *poVar2;
  LogMessage local_2a0;
  StringPiece local_110;
  undefined1 local_100 [8];
  RE2 re;
  Options opt;
  
  this = &re.named_groups_once_;
  RE2::Options::Options((Options *)this);
  RE2::Options::set_encoding((Options *)this,EncodingLatin1);
  StringPiece::StringPiece(&local_110,"g\\p{Zl}]");
  RE2::RE2((RE2 *)local_100,&local_110,(Options *)this);
  bVar1 = RE2::ok((RE2 *)local_100);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_2a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x628);
    poVar2 = LogMessage::stream(&local_2a0);
    std::operator<<(poVar2,"Check failed: re.ok()");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
  }
  RE2::~RE2((RE2 *)local_100);
  return;
}

Assistant:

TEST(RE2, Bug21371806) {
  // Bug in parser accepting Unicode groups in Latin-1 mode,
  // causing compiler to fail in DCHECK in prog.cc.

  RE2::Options opt;
  opt.set_encoding(RE2::Options::EncodingLatin1);

  RE2 re("g\\p{Zl}]", opt);
  CHECK(re.ok());
}